

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O1

void Cmd_remove(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int iVar2;
  char *it;
  
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 != 2) {
    Printf("Usage: remove <actor class name>\n");
    return;
  }
  bVar1 = CheckCheatmode(true);
  if (bVar1) {
    return;
  }
  Net_WriteByte('D');
  it = FCommandLine::operator[](argv,1);
  Net_WriteString(it);
  C_HideConsole();
  return;
}

Assistant:

CCMD(remove)
{
	if (argv.argc() == 2)
	{
		if (CheckCheatmode())
			return;

		Net_WriteByte(DEM_REMOVE);
		Net_WriteString(argv[1]);
		C_HideConsole();
	}
	else
	{
		Printf("Usage: remove <actor class name>\n");
		return;
	}
	
}